

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmStringRange __thiscall
cmTarget::GetInstallIncludeDirectoriesEntries_abi_cxx11_(cmTarget *this,cmTargetExport *te)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  _Base_ptr p_Var2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  cmStringRange cVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empty;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  p_Var5 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->InstallIncludeDirectoriesEntries + 0x10);
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var2 = (_Base_ptr)((long)&(_Var1._M_head_impl)->InstallIncludeDirectoriesEntries + 8);
    p_Var4 = p_Var2;
    do {
      if (*(cmTargetExport **)(p_Var5 + 1) >= te) {
        p_Var4 = p_Var5;
      }
      p_Var5 = *(_Base_ptr *)
                ((long)&p_Var5->_M_left + (ulong)(*(cmTargetExport **)(p_Var5 + 1) < te) * 8);
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((p_Var4 != p_Var2) && (*(cmTargetExport **)(p_Var4 + 1) <= te)) {
      _Var3._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)(p_Var4 + 1) + 8);
      _Var6._M_current =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)(p_Var4 + 1) + 0x10);
      goto LAB_002f66f3;
    }
  }
  local_18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_18);
  _Var3._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Var6._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_002f66f3:
  cVar7.End._M_current = _Var6._M_current;
  cVar7.Begin._M_current = _Var3._M_current;
  return cVar7;
}

Assistant:

cmStringRange cmTarget::GetInstallIncludeDirectoriesEntries(
  cmTargetExport const& te) const
{
  auto i = this->impl->InstallIncludeDirectoriesEntries.find(&te);
  if (i == this->impl->InstallIncludeDirectoriesEntries.end()) {
    decltype(i->second) empty;
    return cmMakeRange(empty);
  }
  return cmMakeRange(i->second);
}